

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O3

void __thiscall WebServer::returnConnInLoop(WebServer *this,HttpConnPtr *conn)

{
  HttpConnPtr local_28;
  
  EventLoop::assertInLoopThread(this->loop_);
  local_28.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (conn->super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  HttpConnPool::addFreeConn(&this->connPool_,&local_28);
  if (local_28.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void WebServer::returnConnInLoop(HttpConnPtr conn) {
    loop_->assertInLoopThread();
    connPool_.addFreeConn(std::move(conn));
}